

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

ParamTestSuiteInfo<RenameParamTest> * __thiscall
iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<RenameParamTest>
          (ParamTestSuiteHolder *this,string *testsuite,string *package)

{
  ParamTestSuiteInfo<RenameParamTest> *this_00;
  ParamTestSuiteInfo<RenameParamTest> *local_28;
  
  this_00 = (ParamTestSuiteInfo<RenameParamTest> *)
            FindTestSuitePatternHolder<std::__cxx11::string>(this,testsuite,package);
  if (this_00 == (ParamTestSuiteInfo<RenameParamTest> *)0x0) {
    this_00 = (ParamTestSuiteInfo<RenameParamTest> *)operator_new(0x88);
    ParamTestSuiteInfo<RenameParamTest>::ParamTestSuiteInfo(this_00,testsuite,package);
    local_28 = this_00;
    std::
    vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>
    ::emplace_back<iutest::detail::IParamTestSuiteInfo*>
              ((vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>
                *)this,(IParamTestSuiteInfo **)&local_28);
  }
  return this_00;
}

Assistant:

ParamTestSuiteInfo<T>* GetTestSuitePatternHolder(const ::std::string& testsuite
        , const ::std::string& package IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        ParamTestSuiteInfo<T>* p = static_cast<ParamTestSuiteInfo<T>*>(FindTestSuitePatternHolder(testsuite, package));
        if( p == NULL )
        {
            p = new ParamTestSuiteInfo<T>(testsuite, package);
            m_testsuite_infos.push_back(p);
        }
        return p;
    }